

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall flatbuffers::go::GoGenerator::~GoGenerator(GoGenerator *this)

{
  GoGenerator *this_local;
  
  (this->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_004fa3c8;
  std::
  set<const_flatbuffers::Definition_*,_flatbuffers::go::GoGenerator::NamespacePtrLess,_std::allocator<const_flatbuffers::Definition_*>_>
  ::~set(&this->tracked_imported_namespaces_);
  IdlNamer::~IdlNamer(&this->namer_);
  Namespace::~Namespace(&this->go_namespace_);
  BaseGenerator::~BaseGenerator(&this->super_BaseGenerator);
  return;
}

Assistant:

GoGenerator(const Parser &parser, const std::string &path,
              const std::string &file_name, const std::string &go_namespace)
      : BaseGenerator(parser, path, file_name, "" /* not used*/,
                      "" /* not used */, "go"),
        cur_name_space_(nullptr),
        namer_(WithFlagOptions(GoDefaultConfig(), parser.opts, path),
               GoKeywords()) {
    std::istringstream iss(go_namespace);
    std::string component;
    while (std::getline(iss, component, '.')) {
      go_namespace_.components.push_back(component);
    }
  }